

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool anon_unknown.dwarf_1264e09::processSources
               (cmGeneratorTarget *tgt,EvaluatedTargetPropertyEntries *entries,
               vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *srcs,unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *uniqueSrcs,bool debugSources)

{
  cmListFileBacktrace *__args_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pbVar2;
  pointer pcVar3;
  cmLocalGenerator *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  byte bVar5;
  bool bVar6;
  byte bVar7;
  string *psVar8;
  cmSourceFile *this_00;
  string *psVar9;
  cmake *pcVar10;
  ostream *poVar11;
  long *plVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long *plVar14;
  ulong *puVar15;
  long lVar16;
  pointer pEVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  char *pcVar18;
  undefined3 in_register_00000081;
  pointer sourceName;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar19;
  string e;
  string w;
  string fullPath;
  __hashtable *__h;
  string usedSources;
  byte local_265;
  string local_260;
  cmGeneratorTarget *local_240;
  string local_238;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  string local_1f8;
  pointer local_1d8;
  undefined4 local_1cc;
  pointer local_1c8;
  vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  cmMakefile *local_1b0;
  cmTarget *local_1a8;
  cmMakefile *local_1a0;
  undefined1 local_198;
  undefined7 uStack_197;
  
  local_1cc = CONCAT31(in_register_00000081,debugSources);
  local_240 = tgt;
  local_1c0 = (vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)srcs;
  local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uniqueSrcs;
  local_1b0 = cmTarget::GetMakefile(tgt->Target);
  bVar5 = entries->HadContextSensitiveCondition;
  pEVar17 = (entries->Entries).
            super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (entries->Entries).
              super__Vector_base<(anonymous_namespace)::EvaluatedTargetPropertyEntry,_std::allocator<(anonymous_namespace)::EvaluatedTargetPropertyEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  bVar7 = bVar5;
  if (pEVar17 != local_1c8) {
    do {
      if (pEVar17->ContextDependent != false) {
        bVar5 = 1;
      }
      psVar8 = cmLinkItem::AsStr_abi_cxx11_(&pEVar17->LinkImplItem->super_cmLinkItem);
      sourceName = (pEVar17->Values).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      pbVar2 = (pEVar17->Values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (sourceName == pbVar2) {
        local_1a8 = (cmTarget *)&stack0xfffffffffffffe68;
        local_1a0 = (cmMakefile *)0x0;
        local_198 = 0;
      }
      else {
        do {
          local_1d8 = pEVar17;
          this_00 = cmMakefile::GetOrCreateSource(local_1b0,sourceName,false,Ambiguous);
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          local_260._M_string_length = 0;
          local_260.field_2._M_allocated_capacity =
               local_260.field_2._M_allocated_capacity & 0xffffffffffffff00;
          local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
          local_238._M_string_length = 0;
          local_238.field_2._M_allocated_capacity =
               local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
          psVar9 = cmSourceFile::ResolveFullPath(this_00,&local_260,&local_238);
          local_218 = &local_208;
          pcVar3 = (psVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_218,pcVar3,pcVar3 + psVar9->_M_string_length);
          pcVar10 = cmLocalGenerator::GetCMakeInstance(local_240->LocalGenerator);
          if (local_238._M_string_length != 0) {
            cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&stack0xfffffffffffffe58);
            cmake::IssueMessage(pcVar10,AUTHOR_WARNING,&local_238,
                                (cmListFileBacktrace *)&stack0xfffffffffffffe58);
            if (local_1a0 != (cmMakefile *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0);
            }
          }
          if (local_210 == 0) {
            if (local_260._M_string_length != 0) {
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)&stack0xfffffffffffffe58);
              cmake::IssueMessage(pcVar10,FATAL_ERROR,&local_260,
                                  (cmListFileBacktrace *)&stack0xfffffffffffffe58);
              if (local_1a0 != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a0);
              }
            }
LAB_00345c34:
            bVar6 = false;
            local_265 = bVar5;
          }
          else {
            if ((psVar8->_M_string_length != 0) &&
               (bVar6 = cmsys::SystemTools::FileIsFullPath(sourceName), !bVar6)) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&stack0xfffffffffffffe58);
              if (psVar8->_M_string_length == 0) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&stack0xfffffffffffffe58,
                           "Found relative path while evaluating sources of \"",0x31);
                psVar9 = cmTarget::GetName_abi_cxx11_(local_240->Target);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&stack0xfffffffffffffe58,(psVar9->_M_dataplus)._M_p,
                                     psVar9->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\":\n  \"",6);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(sourceName->_M_dataplus)._M_p,
                                     sourceName->_M_string_length);
                lVar16 = 2;
                pcVar18 = "\"\n";
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&stack0xfffffffffffffe58,"Target \"",8);
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&stack0xfffffffffffffe58,(psVar8->_M_dataplus)._M_p,
                                     psVar8->_M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar11,"\" contains relative path in its INTERFACE_SOURCES:\n  \"",0x36)
                ;
                poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar11,(sourceName->_M_dataplus)._M_p,
                                     sourceName->_M_string_length);
                lVar16 = 1;
                pcVar18 = "\"";
              }
              std::__ostream_insert<char,std::char_traits<char>>(poVar11,pcVar18,lVar16);
              this = local_240->LocalGenerator;
              std::__cxx11::stringbuf::str();
              cmLocalGenerator::IssueMessage(this,FATAL_ERROR,&local_1f8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stack0xfffffffffffffe58)
              ;
              std::ios_base::~ios_base((ios_base *)&stack0xfffffffffffffec8);
              goto LAB_00345c34;
            }
            bVar6 = true;
            std::__cxx11::string::_M_assign((string *)sourceName);
          }
          if (local_218 != &local_208) {
            operator_delete(local_218,local_208 + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
          }
          bVar7 = local_265;
          if (!bVar6) goto LAB_00346061;
          sourceName = sourceName + 1;
          pEVar17 = local_1d8;
        } while (sourceName != pbVar2);
        __args = (local_1d8->Values).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (local_1d8->Values).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_1a8 = (cmTarget *)&stack0xfffffffffffffe68;
        local_1a0 = (cmMakefile *)0x0;
        local_198 = 0;
        if (__args != pbVar4) {
          __args_1 = &local_1d8->Backtrace;
          paVar1 = &local_238.field_2;
          do {
            local_260._M_dataplus._M_p = (pointer)local_1b8;
            pVar19 = std::
                     _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     ::
                     _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                               ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                                 *)local_1b8,__args,&local_260);
            if (((undefined1  [16])pVar19 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
              emplace_back<std::__cxx11::string_const&,cmListFileBacktrace&>
                        (local_1c0,__args,__args_1);
              if ((char)local_1cc != '\0') {
                std::operator+(&local_238," * ",__args);
                plVar12 = (long *)std::__cxx11::string::append((char *)&local_238);
                local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(plVar12 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar12 == paVar13) {
                  local_260.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_260.field_2._8_8_ = plVar12[3];
                }
                else {
                  local_260.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
                  local_260._M_dataplus._M_p = (pointer)*plVar12;
                }
                local_260._M_string_length = plVar12[1];
                *plVar12 = (long)paVar13;
                plVar12[1] = 0;
                *(undefined1 *)(plVar12 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&stack0xfffffffffffffe58,(ulong)local_260._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260._M_dataplus._M_p != &local_260.field_2) {
                  operator_delete(local_260._M_dataplus._M_p,
                                  local_260.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_238._M_dataplus._M_p != paVar1) {
                  operator_delete(local_238._M_dataplus._M_p,
                                  local_238.field_2._M_allocated_capacity + 1);
                }
              }
            }
            __args = __args + 1;
          } while (__args != pbVar4);
          pEVar17 = local_1d8;
          if (local_1a0 != (cmMakefile *)0x0) {
            pcVar10 = cmLocalGenerator::GetCMakeInstance(local_240->LocalGenerator);
            pEVar17 = local_1d8;
            local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1f8,"Used sources for target ","");
            psVar8 = cmTarget::GetName_abi_cxx11_(local_240->Target);
            plVar12 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_1f8,(ulong)(psVar8->_M_dataplus)._M_p);
            local_218 = &local_208;
            plVar14 = plVar12 + 2;
            if ((long *)*plVar12 == plVar14) {
              local_208 = *plVar14;
              lStack_200 = plVar12[3];
            }
            else {
              local_208 = *plVar14;
              local_218 = (long *)*plVar12;
            }
            local_210 = plVar12[1];
            *plVar12 = (long)plVar14;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::append((char *)&local_218);
            puVar15 = (ulong *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_238.field_2._M_allocated_capacity = *puVar15;
              local_238.field_2._8_8_ = plVar12[3];
              local_238._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_238.field_2._M_allocated_capacity = *puVar15;
              local_238._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_238._M_string_length = plVar12[1];
            *plVar12 = (long)puVar15;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_238,(ulong)local_1a8);
            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
            paVar13 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 == paVar13) {
              local_260.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_260.field_2._8_8_ = plVar12[3];
            }
            else {
              local_260.field_2._M_allocated_capacity = paVar13->_M_allocated_capacity;
              local_260._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_260._M_string_length = plVar12[1];
            *plVar12 = (long)paVar13;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            cmake::IssueMessage(pcVar10,LOG,&local_260,__args_1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_260._M_dataplus._M_p != &local_260.field_2) {
              operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_238._M_dataplus._M_p != paVar1) {
              operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_218 != &local_208) {
              operator_delete(local_218,local_208 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
      }
      if (local_1a8 != (cmTarget *)&stack0xfffffffffffffe68) {
        operator_delete(local_1a8,CONCAT71(uStack_197,local_198) + 1);
      }
      pEVar17 = pEVar17 + 1;
      bVar7 = bVar5;
    } while (pEVar17 != local_1c8);
  }
LAB_00346061:
  return (bool)(bVar7 & 1);
}

Assistant:

bool processSources(cmGeneratorTarget const* tgt,
                    EvaluatedTargetPropertyEntries& entries,
                    std::vector<BT<std::string>>& srcs,
                    std::unordered_set<std::string>& uniqueSrcs,
                    bool debugSources)
{
  cmMakefile* mf = tgt->Target->GetMakefile();

  bool contextDependent = entries.HadContextSensitiveCondition;

  for (EvaluatedTargetPropertyEntry& entry : entries.Entries) {
    if (entry.ContextDependent) {
      contextDependent = true;
    }

    cmLinkImplItem const& item = entry.LinkImplItem;
    std::string const& targetName = item.AsStr();

    for (std::string& src : entry.Values) {
      cmSourceFile* sf = mf->GetOrCreateSource(src);
      std::string e;
      std::string w;
      std::string fullPath = sf->ResolveFullPath(&e, &w);
      cmake* cm = tgt->GetLocalGenerator()->GetCMakeInstance();
      if (!w.empty()) {
        cm->IssueMessage(MessageType::AUTHOR_WARNING, w, tgt->GetBacktrace());
      }
      if (fullPath.empty()) {
        if (!e.empty()) {
          cm->IssueMessage(MessageType::FATAL_ERROR, e, tgt->GetBacktrace());
        }
        return contextDependent;
      }

      if (!targetName.empty() && !cmSystemTools::FileIsFullPath(src)) {
        std::ostringstream err;
        if (!targetName.empty()) {
          err << "Target \"" << targetName
              << "\" contains relative path in its INTERFACE_SOURCES:\n  \""
              << src << "\"";
        } else {
          err << "Found relative path while evaluating sources of \""
              << tgt->GetName() << "\":\n  \"" << src << "\"\n";
        }
        tgt->GetLocalGenerator()->IssueMessage(MessageType::FATAL_ERROR,
                                               err.str());
        return contextDependent;
      }
      src = fullPath;
    }
    std::string usedSources;
    for (std::string const& src : entry.Values) {
      if (uniqueSrcs.insert(src).second) {
        srcs.emplace_back(src, entry.Backtrace);
        if (debugSources) {
          usedSources += " * " + src + "\n";
        }
      }
    }
    if (!usedSources.empty()) {
      tgt->GetLocalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::LOG,
        std::string("Used sources for target ") + tgt->GetName() + ":\n" +
          usedSources,
        entry.Backtrace);
    }
  }
  return contextDependent;
}